

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

int __thiscall SkipList::remove(SkipList *this,char *__filename)

{
  size_type *psVar1;
  Node *pNVar2;
  Node **ppNVar3;
  _Elt_pointer ppNVar4;
  int iVar5;
  undefined8 unaff_RBP;
  Node *local_88;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  
  std::stack<SkipList::Node*,std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>>::
  stack<std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>,void>(&path);
  ppNVar3 = &this->head;
  while (pNVar2 = *ppNVar3, *ppNVar3 != (Node *)0x0) {
    do {
      local_88 = pNVar2;
      pNVar2 = local_88->right;
      if (pNVar2 == (Node *)0x0) break;
    } while ((char *)pNVar2->key < __filename);
    std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::push_back(&path.c,&local_88);
    ppNVar3 = &local_88->down;
  }
  ppNVar4 = path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppNVar4 = path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_88 = ppNVar4[-1]->right;
  if ((local_88 == (Node *)0x0) || ((char *)local_88->key != __filename)) {
    iVar5 = 0;
  }
  else {
    this->length = this->length - 1;
    psVar1 = &(local_88->value)._M_string_length;
    if (this->valueSize < *psVar1) {
      __assert_fail("valueSize >= p->value.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/SkipList.cpp"
                    ,0x54,"bool SkipList::remove(uint64_t)");
    }
    this->valueSize = this->valueSize - *psVar1;
    while( true ) {
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      iVar5 = (int)unaff_RBP;
      if (path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) break;
      ppNVar4 = path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppNVar4 = path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_88 = ppNVar4[-1];
      std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::pop_back(&path.c);
      pNVar2 = local_88->right;
      if ((pNVar2 == (Node *)0x0) || ((char *)pNVar2->key != __filename)) break;
      local_88->right = pNVar2->right;
      std::__cxx11::string::~string((string *)&pNVar2->value);
      operator_delete(pNVar2,0x38);
    }
  }
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::~_Deque_base
            ((_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *)&path);
  return iVar5;
}

Assistant:

bool SkipList::remove(uint64_t key) {
  // search the key
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    path.push(p);
    p = p->down;
  }

  // Does the key exist?
  p = path.top()->right;
  if (!p || p->key != key) return false;

  length--;
  assert(valueSize >= p->value.size());
  valueSize -= p->value.size();
  // remove the tower
  while (!path.empty()) {
    p = path.top();
    path.pop();
    Node *t = p->right;
    if (!t || t->key != key) return true;
    p->right = t->right;
    delete t;
  }
  return true;
}